

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

void deqp::gls::anon_unknown_1::calcShaderColorCoord<float>
               (Vec2 *coord,Vec3 *color,Vector<float,_4> *attribValue,bool isCoordinate,
               int numComponents)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined8 local_54;
  float local_4c;
  Vector<float,_2> local_48;
  Vector<float,_2> local_40;
  Vector<float,_2> local_38;
  Vector<float,_2> local_30;
  int local_28;
  undefined1 local_21;
  int numComponents_local;
  bool isCoordinate_local;
  Vector<float,_4> *attribValue_local;
  Vec3 *color_local;
  Vec2 *coord_local;
  
  local_28 = numComponents;
  local_21 = isCoordinate;
  _numComponents_local = attribValue;
  attribValue_local = (Vector<float,_4> *)color;
  color_local = (Vec3 *)coord;
  if (isCoordinate) {
    switch(numComponents) {
    case 1:
      fVar2 = tcu::Vector<float,_4>::x(attribValue);
      fVar3 = tcu::Vector<float,_4>::x(_numComponents_local);
      tcu::Vector<float,_2>::Vector(&local_30,fVar2,fVar3);
      tcu::Vector<float,_2>::operator+=((Vector<float,_2> *)color_local,&local_30);
      break;
    case 2:
      fVar2 = tcu::Vector<float,_4>::x(attribValue);
      fVar3 = tcu::Vector<float,_4>::y(_numComponents_local);
      tcu::Vector<float,_2>::Vector(&local_38,fVar2,fVar3);
      tcu::Vector<float,_2>::operator+=((Vector<float,_2> *)color_local,&local_38);
      break;
    case 3:
      fVar2 = tcu::Vector<float,_4>::x(attribValue);
      fVar3 = tcu::Vector<float,_4>::z(_numComponents_local);
      fVar4 = tcu::Vector<float,_4>::y(_numComponents_local);
      tcu::Vector<float,_2>::Vector(&local_40,fVar2 + fVar3,fVar4);
      tcu::Vector<float,_2>::operator+=((Vector<float,_2> *)color_local,&local_40);
      break;
    case 4:
      fVar2 = tcu::Vector<float,_4>::x(attribValue);
      fVar3 = tcu::Vector<float,_4>::z(_numComponents_local);
      fVar4 = tcu::Vector<float,_4>::y(_numComponents_local);
      fVar5 = tcu::Vector<float,_4>::w(_numComponents_local);
      tcu::Vector<float,_2>::Vector(&local_48,fVar2 + fVar3,fVar4 + fVar5);
      tcu::Vector<float,_2>::operator+=((Vector<float,_2> *)color_local,&local_48);
    }
  }
  else {
    switch(numComponents) {
    case 1:
      fVar2 = tcu::Vector<float,_4>::x(attribValue);
      tcu::operator*((tcu *)&local_54,color,fVar2);
      *(undefined8 *)attribValue_local->m_data = local_54;
      attribValue_local->m_data[2] = local_4c;
      break;
    case 2:
      pfVar1 = tcu::Vector<float,_3>::x(color);
      fVar2 = *pfVar1;
      fVar3 = tcu::Vector<float,_4>::x(_numComponents_local);
      pfVar1 = tcu::Vector<float,_3>::x((Vector<float,_3> *)attribValue_local);
      *pfVar1 = fVar2 * fVar3;
      pfVar1 = tcu::Vector<float,_3>::y((Vector<float,_3> *)attribValue_local);
      fVar2 = *pfVar1;
      fVar3 = tcu::Vector<float,_4>::y(_numComponents_local);
      pfVar1 = tcu::Vector<float,_3>::y((Vector<float,_3> *)attribValue_local);
      *pfVar1 = fVar2 * fVar3;
      break;
    case 3:
      pfVar1 = tcu::Vector<float,_3>::x(color);
      fVar2 = *pfVar1;
      fVar3 = tcu::Vector<float,_4>::x(_numComponents_local);
      pfVar1 = tcu::Vector<float,_3>::x((Vector<float,_3> *)attribValue_local);
      *pfVar1 = fVar2 * fVar3;
      pfVar1 = tcu::Vector<float,_3>::y((Vector<float,_3> *)attribValue_local);
      fVar2 = *pfVar1;
      fVar3 = tcu::Vector<float,_4>::y(_numComponents_local);
      pfVar1 = tcu::Vector<float,_3>::y((Vector<float,_3> *)attribValue_local);
      *pfVar1 = fVar2 * fVar3;
      pfVar1 = tcu::Vector<float,_3>::z((Vector<float,_3> *)attribValue_local);
      fVar2 = *pfVar1;
      fVar3 = tcu::Vector<float,_4>::z(_numComponents_local);
      pfVar1 = tcu::Vector<float,_3>::z((Vector<float,_3> *)attribValue_local);
      *pfVar1 = fVar2 * fVar3;
      break;
    case 4:
      pfVar1 = tcu::Vector<float,_3>::x(color);
      fVar2 = *pfVar1;
      fVar3 = tcu::Vector<float,_4>::x(_numComponents_local);
      fVar4 = tcu::Vector<float,_4>::w(_numComponents_local);
      pfVar1 = tcu::Vector<float,_3>::x((Vector<float,_3> *)attribValue_local);
      *pfVar1 = fVar2 * fVar3 * fVar4;
      pfVar1 = tcu::Vector<float,_3>::y((Vector<float,_3> *)attribValue_local);
      fVar2 = *pfVar1;
      fVar3 = tcu::Vector<float,_4>::y(_numComponents_local);
      fVar4 = tcu::Vector<float,_4>::w(_numComponents_local);
      pfVar1 = tcu::Vector<float,_3>::y((Vector<float,_3> *)attribValue_local);
      *pfVar1 = fVar2 * fVar3 * fVar4;
      pfVar1 = tcu::Vector<float,_3>::z((Vector<float,_3> *)attribValue_local);
      fVar2 = *pfVar1;
      fVar3 = tcu::Vector<float,_4>::z(_numComponents_local);
      fVar4 = tcu::Vector<float,_4>::w(_numComponents_local);
      pfVar1 = tcu::Vector<float,_3>::z((Vector<float,_3> *)attribValue_local);
      *pfVar1 = fVar2 * fVar3 * fVar4;
    }
  }
  return;
}

Assistant:

void calcShaderColorCoord (tcu::Vec2& coord, tcu::Vec3& color, const tcu::Vector<T, 4>& attribValue, bool isCoordinate, int numComponents)
{
	if (isCoordinate)
		switch (numComponents)
		{
			case 1:	coord += tcu::Vec2((float)attribValue.x(),							(float)attribValue.x());							break;
			case 2:	coord += tcu::Vec2((float)attribValue.x(),							(float)attribValue.y());							break;
			case 3:	coord += tcu::Vec2((float)attribValue.x() + (float)attribValue.z(),	(float)attribValue.y());							break;
			case 4:	coord += tcu::Vec2((float)attribValue.x() + (float)attribValue.z(),	(float)attribValue.y() + (float)attribValue.w());	break;

			default:
				DE_ASSERT(false);
		}
	else
	{
		switch (numComponents)
		{
			case 1:
				color = color * (float)attribValue.x();
				break;

			case 2:
				color.x() = color.x() * (float)attribValue.x();
				color.y() = color.y() * (float)attribValue.y();
				break;

			case 3:
				color.x() = color.x() * (float)attribValue.x();
				color.y() = color.y() * (float)attribValue.y();
				color.z() = color.z() * (float)attribValue.z();
				break;

			case 4:
				color.x() = color.x() * (float)attribValue.x() * (float)attribValue.w();
				color.y() = color.y() * (float)attribValue.y() * (float)attribValue.w();
				color.z() = color.z() * (float)attribValue.z() * (float)attribValue.w();
				break;

			default:
				DE_ASSERT(false);
		}
	}
}